

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_loadRealLP(SoPlexBase<double> *this,bool initBasis)

{
  SPxSolverBase<double> *this_00;
  undefined7 in_register_00000031;
  SPxLPBase<double> *lp;
  
  this_00 = &this->_solver;
  lp = this->_realLP;
  SPxSolverBase<double>::loadLP(this_00,lp,initBasis);
  this->_isRealLPLoaded = true;
  (**(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
     super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)();
  spx_free<soplex::SPxLPBase<double>*>(&this->_realLP);
  this->_realLP = &this_00->super_SPxLPBase<double>;
  if ((int)CONCAT71(in_register_00000031,initBasis) != 0) {
    SPxSolverBase<double>::init(this_00,(EVP_PKEY_CTX *)lp);
    return;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_loadRealLP(bool initBasis)
{
   _solver.loadLP(*_realLP, initBasis);
   _isRealLPLoaded = true;
   _realLP->~SPxLPBase<R>();
   spx_free(_realLP);
   _realLP = &_solver;

   if(initBasis)
      _solver.init();
}